

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

int32_t try_to_int(string *s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  unsigned_long_long uVar4;
  string local_58;
  string local_38;
  string *local_18;
  string *s_local;
  
  local_18 = s;
  std::__cxx11::string::string((string *)&local_58,(string *)s);
  trim(&local_38,&local_58);
  std::__cxx11::string::operator=((string *)s,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  uVar2 = std::__cxx11::string::length();
  if (((2 < uVar2) && (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar3 == '0'))
     && ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar3 == 'x' ||
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar3 == 'X')))) {
    uVar4 = std::__cxx11::stoull(s,(size_t *)0x0,0);
    return (int32_t)uVar4;
  }
  iVar1 = std::__cxx11::stoi(s,(size_t *)0x0,10);
  return iVar1;
}

Assistant:

inline std::int32_t try_to_int(std::string s) {
    s = trim(s);
    if (s.length() > 2 && s[0] == '0' && (s[1] == 'x' || s[1] == 'X')) {
        return static_cast<std::int32_t>(std::stoull(s, 0, 0));
    }
    else {
        return std::stoi(s);
    }
}